

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction_base.cpp
# Opt level: O3

SignDataType cfd::js::api::ConvertToSignDataType(string *data_type)

{
  int iVar1;
  SignDataType SVar2;
  CfdException *this;
  undefined1 local_40 [32];
  
  iVar1 = std::__cxx11::string::compare((char *)data_type);
  if (iVar1 == 0) {
    SVar2 = kSign;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)data_type);
    if (iVar1 == 0) {
      SVar2 = kBinary;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)data_type);
      if (iVar1 == 0) {
        SVar2 = kPubkey;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)data_type);
        if (iVar1 == 0) {
          SVar2 = kRedeemScript;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)data_type);
          SVar2 = kOpCode;
          if (iVar1 != 0) {
            local_40._0_8_ = "cfdjs_transaction_base.cpp";
            local_40._8_4_ = 0x3e;
            local_40._16_8_ = "ConvertToSignDataType";
            core::logger::log<std::__cxx11::string_const&>
                      ((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
                       "Failed to ConvertToSignDataType. Invalid data_type string passed. data_type=[{}]"
                       ,data_type);
            this = (CfdException *)__cxa_allocate_exception(0x30);
            local_40._0_8_ = local_40 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_40,
                       "Sign data type convert error. Invalid data_type string passed.","");
            core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_40);
            __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
        }
      }
    }
  }
  return SVar2;
}

Assistant:

static SignDataType ConvertToSignDataType(const std::string& data_type) {
  if (data_type == "sign") {
    return SignDataType::kSign;
  } else if (data_type == "binary") {
    return SignDataType::kBinary;
  } else if (data_type == "pubkey") {
    return SignDataType::kPubkey;
  } else if (data_type == "redeem_script") {
    return SignDataType::kRedeemScript;
  } else if (data_type == "op_code") {
    return SignDataType::kOpCode;
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to ConvertToSignDataType. Invalid data_type string passed. "
        "data_type=[{}]",
        data_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Sign data type convert error. Invalid data_type string passed.");
  }
}